

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdDecomposeInternal(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  
  iVar1 = Dau_DsdDecomposeSingleVar(p,pTruth,pVars,nVars);
  if (iVar1 != 0) {
    iVar1 = Dau_DsdDecomposeDoubleVars(p,pTruth,pVars,iVar1);
    if (iVar1 != 0) {
      iVar1 = Dau_DsdDecomposeTripleVars(p,pTruth,pVars,iVar1);
      if (iVar1 != 0) {
        iVar1 = Dau_DsdWritePrime(p,pTruth,pVars,iVar1);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

int Dau_DsdDecomposeInternal( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    // decompose single variales on the output side
    nVars = Dau_DsdDecomposeSingleVar( p, pTruth, pVars, nVars );
    if ( nVars == 0 )
        return 0;
    // decompose double variables on the input side
    nVars = Dau_DsdDecomposeDoubleVars( p, pTruth, pVars, nVars );
    if ( nVars == 0 )
        return 0;
    // decompose MUX on the output/input side
    nVars = Dau_DsdDecomposeTripleVars( p, pTruth, pVars, nVars );
    if ( nVars == 0 )
        return 0;
    // write non-decomposable function
    return Dau_DsdWritePrime( p, pTruth, pVars, nVars );
}